

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O3

t_namelist * namelist_append_files(t_namelist *listwas,char *s)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char temp [1000];
  char local_3f8 [999];
  undefined1 local_11;
  
  do {
    lVar2 = 0;
    do {
      cVar1 = s[lVar2];
      if ((cVar1 == '\0') || (cVar1 == ':')) {
        local_3f8[lVar2] = '\0';
        if (lVar2 != 0) goto LAB_00176eb8;
        s = (char *)0x0;
        goto LAB_00176ed1;
      }
      local_3f8[lVar2] = cVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 999);
    local_11 = 0;
    lVar2 = 999;
LAB_00176eb8:
    pcVar3 = s + lVar2;
    s = (char *)0x0;
    if (*pcVar3 != '\0') {
      s = pcVar3 + 1;
    }
LAB_00176ed1:
    if (local_3f8[0] != '\0') {
      listwas = namelist_append(listwas,local_3f8,0);
    }
    if (s == (char *)0x0) {
      return listwas;
    }
  } while( true );
}

Assistant:

t_namelist *namelist_append_files(t_namelist *listwas, const char *s)
{
    const char *npos;
    char temp[MAXPDSTRING];
    t_namelist *nl = listwas;

    npos = s;
    do
    {
        npos = strtokcpy(temp, sizeof(temp), npos, SEPARATOR);
        if (! *temp) continue;
        nl = namelist_append(nl, temp, 0);
    }
        while (npos);
    return (nl);
}